

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleScrollAdapter.cpp
# Opt level: O1

void __thiscall cursespp::SimpleScrollAdapter::SimpleScrollAdapter(SimpleScrollAdapter *this)

{
  connections_list *pcVar1;
  _Rb_tree_header *p_Var2;
  
  ScrollAdapterBase::ScrollAdapterBase(&this->super_ScrollAdapterBase);
  (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter =
       (_func_int **)&PTR__SimpleScrollAdapter_001aa3a8;
  (this->Changed).
  super__signal_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a69e0;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->Changed).
                      super__signal_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar1 = &(this->Changed).
            super__signal_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>.
            m_connected_slots;
  *(connections_list **)
   ((long)&(this->Changed).
           super__signal_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>.
           m_connected_slots.
           super__List_base<sigslot::_connection_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base + 8) = pcVar1;
  (this->Changed).
  super__signal_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar1;
  (this->Changed).
  super__signal_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->Changed).
  super__signal_base1<cursespp::SimpleScrollAdapter_*,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal1_001aa430;
  p_Var2 = &(this->indexToColor)._M_t._M_impl.super__Rb_tree_header;
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->indexToColor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->entries).
  super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  ::_M_initialize_map(&(this->entries).
                       super__Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                      ,0);
  this->maxEntries = 0xffffffff;
  this->selectable = false;
  return;
}

Assistant:

SimpleScrollAdapter::SimpleScrollAdapter() {
    this->maxEntries = MAX_ENTRY_COUNT;
    this->selectable = false;
}